

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O3

pboolean p_tree_avl_insert(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,ppointer key
                          ,ppointer value)

{
  int iVar1;
  PTreeAVLNode *node;
  PTreeAVLNode_ *pPVar2;
  pint pVar3;
  PTreeBaseNode_ *pPVar4;
  PTreeBaseNode_ *pPVar5;
  pint pVar6;
  PTreeBaseNode *pPVar7;
  PTreeBaseNode *pPVar8;
  
  pPVar4 = *root_node;
  pPVar5 = (PTreeBaseNode_ *)root_node;
  pPVar7 = pPVar4;
  if (pPVar4 == (PTreeBaseNode *)0x0) {
    pPVar7 = (PTreeBaseNode *)0x0;
  }
  else {
    do {
      pVar3 = (*compare_func)(key,pPVar4->key,data);
      if (pVar3 < 0) {
        pPVar5 = pPVar5->left;
        pPVar7 = pPVar5;
      }
      else {
        pPVar8 = pPVar5->left;
        if (pVar3 == 0) {
          if (pPVar8 != (PTreeBaseNode *)0x0) {
            if (key_destroy_func != (PDestroyFunc)0x0) {
              (*key_destroy_func)(pPVar8->key);
              pPVar8 = pPVar5->left;
            }
            if (value_destroy_func != (PDestroyFunc)0x0) {
              (*value_destroy_func)(pPVar8->value);
              pPVar8 = pPVar5->left;
            }
            pPVar8->key = key;
            pPVar5->left->value = value;
            return 0;
          }
          break;
        }
        pPVar5 = (PTreeBaseNode_ *)&pPVar8->right;
        pPVar7 = pPVar8;
      }
      pPVar4 = pPVar5->left;
    } while (pPVar4 != (PTreeBaseNode_ *)0x0);
  }
  pPVar4 = (PTreeBaseNode_ *)p_malloc0(0x30);
  pPVar5->left = pPVar4;
  pVar3 = 0;
  if (pPVar4 != (PTreeBaseNode_ *)0x0) {
    pPVar4->key = key;
    pPVar5->left->value = value;
    pPVar4 = pPVar5->left;
    *(undefined4 *)&pPVar4[1].right = 0;
    pPVar4[1].left = pPVar7;
    pVar3 = 1;
    node = (PTreeAVLNode *)pPVar5->left;
    for (pPVar2 = ((PTreeAVLNode *)pPVar5->left)->parent; pPVar2 != (PTreeAVLNode_ *)0x0;
        pPVar2 = pPVar2->parent) {
      iVar1 = pPVar2->balance_factor;
      if ((PTreeAVLNode *)(pPVar2->base).left == node) {
        if (iVar1 == -1) goto LAB_0010a4d3;
        pVar6 = pVar3;
        if (iVar1 == 1) {
          if (node->balance_factor == -1) {
            pp_tree_avl_rotate_left_right(node,root_node);
            return 1;
          }
          pp_tree_avl_rotate_right(node,root_node);
          return 1;
        }
      }
      else {
        if (iVar1 == 1) {
LAB_0010a4d3:
          pPVar2->balance_factor = 0;
          return 1;
        }
        pVar6 = -1;
        if (iVar1 == -1) {
          if (node->balance_factor == 1) {
            pp_tree_avl_rotate_right_left(node,root_node);
            return 1;
          }
          pp_tree_avl_rotate_left(node,root_node);
          return 1;
        }
      }
      pPVar2->balance_factor = pVar6;
      node = pPVar2;
    }
  }
  return pVar3;
}

Assistant:

pboolean
p_tree_avl_insert (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   ppointer		key,
		   ppointer		value)
{
	PTreeBaseNode	**cur_node;
	PTreeBaseNode	*parent_node;
	pint		cmp_result;

	cur_node    = root_node;
	parent_node = *root_node;

	/* Find where to insert the node */
	while (*cur_node != NULL) {
		cmp_result = compare_func (key, (*cur_node)->key, data);

		if (cmp_result < 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->left;
		} else if (cmp_result > 0) {
			parent_node = *cur_node;
			cur_node    = &(*cur_node)->right;
		} else
			break;
	}

	/* If we have existing one - replace a key-value pair */
	if (*cur_node != NULL) {
		if (key_destroy_func != NULL)
			key_destroy_func ((*cur_node)->key);

		if (value_destroy_func != NULL)
			value_destroy_func ((*cur_node)->value);

		(*cur_node)->key   = key;
		(*cur_node)->value = value;

		return FALSE;
	}

	if (P_UNLIKELY ((*cur_node = p_malloc0 (sizeof (PTreeAVLNode))) == NULL))
		return FALSE;

	(*cur_node)->key   = key;
	(*cur_node)->value = value;

	((PTreeAVLNode *) *cur_node)->balance_factor = 0;
	((PTreeAVLNode *) *cur_node)->parent         = (PTreeAVLNode *) parent_node;

	/* Balance the tree */
	pp_tree_avl_balance_insert (((PTreeAVLNode *) *cur_node), root_node);

	return TRUE;
}